

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBox::mouseMoveEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool up;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
  uVar1 = QEventPoint::position();
  auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar6 = minpd(_DAT_0066f5d0,auVar6);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar2 = movmskpd(uVar1,auVar5);
  uVar4 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar4 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
  }
  uVar3 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar6._8_8_;
  }
  local_28 = (QPoint)(uVar3 | uVar4);
  QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
  if (((this_00->spinClickTimer).m_id == Invalid) || (this_00->buttonSymbols == NoButtons))
  goto LAB_00482edd;
  uVar4 = (**(code **)(*(long *)this + 0x1c8))(this);
  if (((uVar4 & 1) == 0) || (this_00->hoverControl != SC_ComboBoxFrame)) {
    if (((uVar4 & 2) != 0) && (this_00->hoverControl == SC_ComboBoxEditField)) {
      up = false;
      goto LAB_00482ec8;
    }
    QAbstractSpinBoxPrivate::reset(this_00);
  }
  else {
    up = true;
LAB_00482ec8:
    QAbstractSpinBoxPrivate::updateState(this_00,up,false);
  }
  event[0xc] = (QMouseEvent)0x1;
LAB_00482edd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    d->updateHoverControl(event->position().toPoint());

    // If we have a timer ID, update the state
    if (d->spinClickTimer.isActive() && d->buttonSymbols != NoButtons) {
        const StepEnabled se = stepEnabled();
        if ((se & StepUpEnabled) && d->hoverControl == QStyle::SC_SpinBoxUp)
            d->updateState(true);
        else if ((se & StepDownEnabled) && d->hoverControl == QStyle::SC_SpinBoxDown)
            d->updateState(false);
        else
            d->reset();
        event->accept();
    }
}